

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::PatchPutValueWithThisPtrNoFastPath
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               Var thisInstance,PropertyOperationFlags flags)

{
  ImplicitCallFlags *pIVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  RecyclableObject *instance_00;
  undefined1 local_98 [8];
  PropertyValueInfo info;
  
  info._56_8_ = thisInstance;
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    SetPropertyOnTaggedNumber
              (instance,(RecyclableObject *)0x0,propertyId,newValue,scriptContext,flags);
    return;
  }
  instance_00 = VarTo<Js::RecyclableObject>(instance);
  local_98 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_98,functionBody,inlineCache,inlineCacheIndex,true);
  BVar3 = OP_SetProperty(instance_00,propertyId,newValue,scriptContext,(PropertyValueInfo *)local_98
                         ,flags,(Var)info._56_8_);
  if (BVar3 == 0) {
    pIVar1 = &scriptContext->threadContext->implicitCallFlags;
    *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
  }
  return;
}

Assistant:

void JavascriptOperators::PatchPutValueWithThisPtrNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, Var thisInstance, PropertyOperationFlags flags)
    {
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        if (TaggedNumber::Is(instance))
        {
            JavascriptOperators::SetPropertyOnTaggedNumber(instance, nullptr, propertyId, newValue, scriptContext, flags);
            return;
        }
        RecyclableObject* object = VarTo<RecyclableObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        if (!JavascriptOperators::OP_SetProperty(object, propertyId, newValue, scriptContext, &info, flags, thisInstance))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
    }